

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O1

void __thiscall sznet::net::KcpConnection::forceClose(KcpConnection *this)

{
  EventLoop *this_00;
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Functor local_58;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  if ((this->m_state < (kConnected|kDelayDisconnecting)) &&
     ((0x1aU >> (this->m_state & 0x1f) & 1) != 0)) {
    this->m_state = kDisconnecting;
    this_00 = this->m_loop;
    std::__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::KcpConnection,void>
              ((__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (__weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    p_Var2 = p_Stack_30;
    uVar1 = local_38;
    local_38 = 0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58 = (Functor)(ZEXT432(0) << 0x40);
    puVar3 = (undefined8 *)operator_new(0x20);
    *puVar3 = forceCloseInLoop;
    puVar3[1] = 0;
    puVar3[2] = uVar1;
    puVar3[3] = p_Var2;
    local_58.super__Function_base._M_functor._M_unused._M_object = puVar3;
    local_58.super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_std::_Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>_>
         ::_M_manager;
    local_58._M_invoker =
         std::
         _Function_handler<void_(),_std::_Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>_>
         ::_M_invoke;
    EventLoop::queueInLoop(this_00,&local_58);
    if (local_58.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_58.super__Function_base._M_manager)
                ((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
    }
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
  }
  return;
}

Assistant:

void KcpConnection::forceClose()
{
	// FIXME: use compare and swap
	if (m_state == kConnected || m_state == kConnecting || m_state == kDelayDisconnecting)
	{
		setState(kDisconnecting);
		m_loop->queueInLoop(std::bind(&KcpConnection::forceCloseInLoop, shared_from_this()));
	}
}